

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPlugin.cpp
# Opt level: O2

MemoryReportFormatter * __thiscall
MemoryReporterPlugin::createMemoryFormatter(MemoryReporterPlugin *this,SimpleString *type)

{
  bool bVar1;
  CodeMemoryReportFormatter *this_00;
  TestMemoryAllocator *internalAllocator;
  SimpleString SStack_28;
  
  SimpleString::SimpleString(&SStack_28,"normal");
  bVar1 = operator==(type,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  if (bVar1) {
    this_00 = (CodeMemoryReportFormatter *)
              operator_new(8,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MemoryReporterPlugin.cpp"
                           ,0x3c);
    NormalMemoryReportFormatter::NormalMemoryReportFormatter((NormalMemoryReportFormatter *)this_00)
    ;
  }
  else {
    SimpleString::SimpleString(&SStack_28,"code");
    bVar1 = operator==(type,&SStack_28);
    SimpleString::~SimpleString(&SStack_28);
    if (bVar1) {
      this_00 = (CodeMemoryReportFormatter *)
                operator_new(0x18,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MemoryReporterPlugin.cpp"
                             ,0x3f);
      internalAllocator = defaultMallocAllocator();
      CodeMemoryReportFormatter::CodeMemoryReportFormatter(this_00,internalAllocator);
    }
    else {
      this_00 = (CodeMemoryReportFormatter *)0x0;
    }
  }
  return &this_00->super_MemoryReportFormatter;
}

Assistant:

MemoryReportFormatter* MemoryReporterPlugin::createMemoryFormatter(const SimpleString& type)
{
    if (type == "normal") {
        return  new NormalMemoryReportFormatter;
    }
    else if (type == "code") {
        return new CodeMemoryReportFormatter(defaultMallocAllocator());
    }
    return NULLPTR;
}